

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3DbExec(int *pRc,sqlite3 *db,char *zFormat,...)

{
  long lVar1;
  char in_AL;
  int iVar2;
  char *pcVar3;
  char *in_RCX;
  int *in_RDI;
  char **in_R9;
  long in_FS_OFFSET;
  void *in_XMM0_Qa;
  sqlite3_callback in_XMM0_Qb;
  char *in_XMM1_Qa;
  sqlite3 *in_XMM1_Qb;
  char *zSql;
  va_list ap;
  __va_list_tag *in_stack_ffffffffffffff18;
  void *in_stack_ffffffffffffff38;
  sqlite3_callback in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  sqlite3 *in_stack_ffffffffffffff50;
  
  if (in_AL != '\0') {
    in_stack_ffffffffffffff38 = in_XMM0_Qa;
    in_stack_ffffffffffffff40 = in_XMM0_Qb;
    in_stack_ffffffffffffff48 = in_XMM1_Qa;
    in_stack_ffffffffffffff50 = in_XMM1_Qb;
  }
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_RDI == 0) {
    pcVar3 = sqlite3_vmprintf(in_RCX,in_stack_ffffffffffffff18);
    if (pcVar3 == (char *)0x0) {
      *in_RDI = 7;
    }
    else {
      iVar2 = sqlite3_exec(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                           in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_R9);
      *in_RDI = iVar2;
      sqlite3_free((void *)0x24abc6);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fts3DbExec(
  int *pRc,              /* Success code */
  sqlite3 *db,           /* Database in which to run SQL */
  const char *zFormat,   /* Format string for SQL */
  ...                    /* Arguments to the format string */
){
  va_list ap;
  char *zSql;
  if( *pRc ) return;
  va_start(ap, zFormat);
  zSql = sqlite3_vmprintf(zFormat, ap);
  va_end(ap);
  if( zSql==0 ){
    *pRc = SQLITE_NOMEM;
  }else{
    *pRc = sqlite3_exec(db, zSql, 0, 0, 0);
    sqlite3_free(zSql);
  }
}